

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O1

enable_if_t<std::is_unsigned<unsigned_char>::value,_unsigned_char> __thiscall
burst::divceil<unsigned_char,unsigned_short>
          (burst *this,Integer<unsigned_char> n,Integer<unsigned_short> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_char>::value,_unsigned_char> eVar1;
  domain_error *this_00;
  undefined6 in_register_00000012;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,n);
  if (uVar2 != 0) {
    if ((char)this == '\0') {
      eVar1 = '\0';
    }
    else {
      eVar1 = (char)((int)(((uint)this & 0xff) - 1) / (int)(uVar2 & 0xffff)) + '\x01';
    }
    return eVar1;
  }
  this_00 = (domain_error *)
            __cxa_allocate_exception
                      (0x10,CONCAT71(in_register_00000031,n),CONCAT62(in_register_00000012,divisor))
  ;
  std::domain_error::domain_error(this_00,anon_var_dwarf_1eff9);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }